

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PUGIXML_DOMDocument.cpp
# Opt level: O0

DOMNodePtr __thiscall FIX::PUGIXML_DOMNode::getFirstChildNode(PUGIXML_DOMNode *this)

{
  bool bVar1;
  PUGIXML_DOMNode *this_00;
  long in_RSI;
  xml_node local_20;
  xml_node pNode;
  PUGIXML_DOMNode *this_local;
  
  local_20 = pugi::xml_node::first_child((xml_node *)(in_RSI + 8));
  bVar1 = pugi::xml_node::operator!(&local_20);
  if (bVar1) {
    std::unique_ptr<FIX::DOMNode,std::default_delete<FIX::DOMNode>>::
    unique_ptr<std::default_delete<FIX::DOMNode>,void>
              ((unique_ptr<FIX::DOMNode,std::default_delete<FIX::DOMNode>> *)this);
  }
  else {
    this_00 = (PUGIXML_DOMNode *)operator_new(0x10);
    PUGIXML_DOMNode(this_00,local_20);
    std::unique_ptr<FIX::DOMNode,std::default_delete<FIX::DOMNode>>::
    unique_ptr<std::default_delete<FIX::DOMNode>,void>
              ((unique_ptr<FIX::DOMNode,std::default_delete<FIX::DOMNode>> *)this,(pointer)this_00);
  }
  return (__uniq_ptr_data<FIX::DOMNode,_std::default_delete<FIX::DOMNode>,_true,_true>)
         (__uniq_ptr_data<FIX::DOMNode,_std::default_delete<FIX::DOMNode>,_true,_true>)this;
}

Assistant:

DOMNodePtr PUGIXML_DOMNode::getFirstChildNode()
  {
    pugi::xml_node pNode = m_pNode.first_child();
    if( !pNode ) return DOMNodePtr();
    return DOMNodePtr(new PUGIXML_DOMNode(pNode));
  }